

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::PrintExpressionContents,_void>::visit
          (Visitor<wasm::PrintExpressionContents,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::PrintExpressionContents,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      PrintExpressionContents::visitBlock((PrintExpressionContents *)this,(Block *)curr);
      break;
    case IfId:
      PrintExpressionContents::visitIf((PrintExpressionContents *)this,(If *)curr);
      break;
    case LoopId:
      PrintExpressionContents::visitLoop((PrintExpressionContents *)this,(Loop *)curr);
      break;
    case BreakId:
      PrintExpressionContents::visitBreak((PrintExpressionContents *)this,(Break *)curr);
      break;
    case SwitchId:
      PrintExpressionContents::visitSwitch((PrintExpressionContents *)this,(Switch *)curr);
      break;
    case CallId:
      PrintExpressionContents::visitCall((PrintExpressionContents *)this,(Call *)curr);
      break;
    case CallIndirectId:
      PrintExpressionContents::visitCallIndirect
                ((PrintExpressionContents *)this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      PrintExpressionContents::visitLocalGet((PrintExpressionContents *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      PrintExpressionContents::visitLocalSet((PrintExpressionContents *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      PrintExpressionContents::visitGlobalGet((PrintExpressionContents *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      PrintExpressionContents::visitGlobalSet((PrintExpressionContents *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      PrintExpressionContents::visitLoad((PrintExpressionContents *)this,(Load *)curr);
      break;
    case StoreId:
      PrintExpressionContents::visitStore((PrintExpressionContents *)this,(Store *)curr);
      break;
    case ConstId:
      PrintExpressionContents::visitConst((PrintExpressionContents *)this,(Const *)curr);
      break;
    case UnaryId:
      PrintExpressionContents::visitUnary((PrintExpressionContents *)this,(Unary *)curr);
      break;
    case BinaryId:
      PrintExpressionContents::visitBinary((PrintExpressionContents *)this,(Binary *)curr);
      break;
    case SelectId:
      PrintExpressionContents::visitSelect((PrintExpressionContents *)this,(Select *)curr);
      break;
    case DropId:
      PrintExpressionContents::visitDrop((PrintExpressionContents *)this,(Drop *)curr);
      break;
    case ReturnId:
      PrintExpressionContents::visitReturn((PrintExpressionContents *)this,(Return *)curr);
      break;
    case MemorySizeId:
      PrintExpressionContents::visitMemorySize((PrintExpressionContents *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      PrintExpressionContents::visitMemoryGrow((PrintExpressionContents *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      PrintExpressionContents::visitNop((PrintExpressionContents *)this,(Nop *)curr);
      break;
    case UnreachableId:
      PrintExpressionContents::visitUnreachable((PrintExpressionContents *)this,(Unreachable *)curr)
      ;
      break;
    case AtomicRMWId:
      PrintExpressionContents::visitAtomicRMW((PrintExpressionContents *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      PrintExpressionContents::visitAtomicCmpxchg
                ((PrintExpressionContents *)this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      PrintExpressionContents::visitAtomicWait((PrintExpressionContents *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      PrintExpressionContents::visitAtomicNotify
                ((PrintExpressionContents *)this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      PrintExpressionContents::visitAtomicFence((PrintExpressionContents *)this,(AtomicFence *)curr)
      ;
      break;
    case SIMDExtractId:
      PrintExpressionContents::visitSIMDExtract((PrintExpressionContents *)this,(SIMDExtract *)curr)
      ;
      break;
    case SIMDReplaceId:
      PrintExpressionContents::visitSIMDReplace((PrintExpressionContents *)this,(SIMDReplace *)curr)
      ;
      break;
    case SIMDShuffleId:
      PrintExpressionContents::visitSIMDShuffle((PrintExpressionContents *)this,(SIMDShuffle *)curr)
      ;
      break;
    case SIMDTernaryId:
      PrintExpressionContents::visitSIMDTernary((PrintExpressionContents *)this,(SIMDTernary *)curr)
      ;
      break;
    case SIMDShiftId:
      PrintExpressionContents::visitSIMDShift((PrintExpressionContents *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      PrintExpressionContents::visitSIMDLoad((PrintExpressionContents *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      PrintExpressionContents::visitSIMDLoadStoreLane
                ((PrintExpressionContents *)this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      PrintExpressionContents::visitMemoryInit((PrintExpressionContents *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      PrintExpressionContents::visitDataDrop((PrintExpressionContents *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      PrintExpressionContents::visitMemoryCopy((PrintExpressionContents *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      PrintExpressionContents::visitMemoryFill((PrintExpressionContents *)this,(MemoryFill *)curr);
      break;
    case PopId:
      PrintExpressionContents::visitPop((PrintExpressionContents *)this,(Pop *)curr);
      break;
    case RefNullId:
      PrintExpressionContents::visitRefNull((PrintExpressionContents *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      PrintExpressionContents::visitRefIsNull((PrintExpressionContents *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      PrintExpressionContents::visitRefFunc((PrintExpressionContents *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      PrintExpressionContents::visitRefEq((PrintExpressionContents *)this,(RefEq *)curr);
      break;
    case TableGetId:
      PrintExpressionContents::visitTableGet((PrintExpressionContents *)this,(TableGet *)curr);
      break;
    case TableSetId:
      PrintExpressionContents::visitTableSet((PrintExpressionContents *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      PrintExpressionContents::visitTableSize((PrintExpressionContents *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      PrintExpressionContents::visitTableGrow((PrintExpressionContents *)this,(TableGrow *)curr);
      break;
    case TableFillId:
      PrintExpressionContents::visitTableFill((PrintExpressionContents *)this,(TableFill *)curr);
      break;
    case TableCopyId:
      PrintExpressionContents::visitTableCopy((PrintExpressionContents *)this,(TableCopy *)curr);
      break;
    case TableInitId:
      PrintExpressionContents::visitTableInit((PrintExpressionContents *)this,(TableInit *)curr);
      break;
    case TryId:
      PrintExpressionContents::visitTry((PrintExpressionContents *)this,(Try *)curr);
      break;
    case TryTableId:
      PrintExpressionContents::visitTryTable((PrintExpressionContents *)this,(TryTable *)curr);
      break;
    case ThrowId:
      PrintExpressionContents::visitThrow((PrintExpressionContents *)this,(Throw *)curr);
      break;
    case RethrowId:
      PrintExpressionContents::visitRethrow((PrintExpressionContents *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      PrintExpressionContents::visitThrowRef((PrintExpressionContents *)this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      PrintExpressionContents::visitTupleMake((PrintExpressionContents *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      PrintExpressionContents::visitTupleExtract
                ((PrintExpressionContents *)this,(TupleExtract *)curr);
      break;
    case RefI31Id:
      PrintExpressionContents::visitRefI31((PrintExpressionContents *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      PrintExpressionContents::visitI31Get((PrintExpressionContents *)this,(I31Get *)curr);
      break;
    case CallRefId:
      PrintExpressionContents::visitCallRef((PrintExpressionContents *)this,(CallRef *)curr);
      break;
    case RefTestId:
      PrintExpressionContents::visitRefTest((PrintExpressionContents *)this,(RefTest *)curr);
      break;
    case RefCastId:
      PrintExpressionContents::visitRefCast((PrintExpressionContents *)this,(RefCast *)curr);
      break;
    case BrOnId:
      PrintExpressionContents::visitBrOn((PrintExpressionContents *)this,(BrOn *)curr);
      break;
    case StructNewId:
      PrintExpressionContents::visitStructNew((PrintExpressionContents *)this,(StructNew *)curr);
      break;
    case StructGetId:
      PrintExpressionContents::visitStructGet((PrintExpressionContents *)this,(StructGet *)curr);
      break;
    case StructSetId:
      PrintExpressionContents::visitStructSet((PrintExpressionContents *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      PrintExpressionContents::visitStructRMW((PrintExpressionContents *)this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      PrintExpressionContents::visitStructCmpxchg
                ((PrintExpressionContents *)this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      PrintExpressionContents::visitArrayNew((PrintExpressionContents *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      PrintExpressionContents::visitArrayNewData
                ((PrintExpressionContents *)this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      PrintExpressionContents::visitArrayNewElem
                ((PrintExpressionContents *)this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      PrintExpressionContents::visitArrayNewFixed
                ((PrintExpressionContents *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      PrintExpressionContents::visitArrayGet((PrintExpressionContents *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      PrintExpressionContents::visitArraySet((PrintExpressionContents *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      PrintExpressionContents::visitArrayLen((PrintExpressionContents *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      PrintExpressionContents::visitArrayCopy((PrintExpressionContents *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      PrintExpressionContents::visitArrayFill((PrintExpressionContents *)this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      PrintExpressionContents::visitArrayInitData
                ((PrintExpressionContents *)this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      PrintExpressionContents::visitArrayInitElem
                ((PrintExpressionContents *)this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      PrintExpressionContents::visitRefAs((PrintExpressionContents *)this,(RefAs *)curr);
      break;
    case StringNewId:
      PrintExpressionContents::visitStringNew((PrintExpressionContents *)this,(StringNew *)curr);
      break;
    case StringConstId:
      PrintExpressionContents::visitStringConst((PrintExpressionContents *)this,(StringConst *)curr)
      ;
      break;
    case StringMeasureId:
      PrintExpressionContents::visitStringMeasure
                ((PrintExpressionContents *)this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      PrintExpressionContents::visitStringEncode
                ((PrintExpressionContents *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      PrintExpressionContents::visitStringConcat
                ((PrintExpressionContents *)this,(StringConcat *)curr);
      break;
    case StringEqId:
      PrintExpressionContents::visitStringEq((PrintExpressionContents *)this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      PrintExpressionContents::visitStringWTF16Get
                ((PrintExpressionContents *)this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      PrintExpressionContents::visitStringSliceWTF
                ((PrintExpressionContents *)this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      PrintExpressionContents::visitContNew((PrintExpressionContents *)this,(ContNew *)curr);
      break;
    case ContBindId:
      PrintExpressionContents::visitContBind((PrintExpressionContents *)this,(ContBind *)curr);
      break;
    case SuspendId:
      PrintExpressionContents::visitSuspend((PrintExpressionContents *)this,(Suspend *)curr);
      break;
    case ResumeId:
      PrintExpressionContents::visitResume((PrintExpressionContents *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      PrintExpressionContents::visitResumeThrow((PrintExpressionContents *)this,(ResumeThrow *)curr)
      ;
      break;
    case StackSwitchId:
      PrintExpressionContents::visitStackSwitch((PrintExpressionContents *)this,(StackSwitch *)curr)
      ;
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrintExpressionContents>::visit(Expression *) [SubType = wasm::PrintExpressionContents, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }